

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalReleaseMutex(CPalThread *pthr,HANDLE hMutex)

{
  long *local_30;
  ISynchStateController *pssc;
  IPalObject *pobjMutex;
  HANDLE pVStack_18;
  PAL_ERROR palError;
  HANDLE hMutex_local;
  CPalThread *pthr_local;
  
  pobjMutex._4_4_ = 0;
  pssc = (ISynchStateController *)0x0;
  local_30 = (long *)0x0;
  pVStack_18 = hMutex;
  hMutex_local = pthr;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalReleaseMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x15c);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  pobjMutex._4_4_ =
       (**(code **)(*g_pObjectManager + 0x28))
                 (g_pObjectManager,hMutex_local,pVStack_18,&aotMutex,0,&pssc);
  if (pobjMutex._4_4_ == 0) {
    pobjMutex._4_4_ = (*pssc->_vptr_ISynchStateController[5])(pssc,hMutex_local,&local_30);
    if (pobjMutex._4_4_ == 0) {
      pobjMutex._4_4_ = (**(code **)(*local_30 + 0x28))();
      if ((pobjMutex._4_4_ != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
        abort();
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalReleaseMutex",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
              ,0x178);
      fprintf(_stderr,"Error %d obtaining synch state controller\n",(ulong)pobjMutex._4_4_);
    }
  }
  else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x30))();
  }
  if (pssc != (ISynchStateController *)0x0) {
    (*pssc->_vptr_ISynchStateController[8])(pssc,hMutex_local);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pobjMutex._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalReleaseMutex(
    CPalThread *pthr,
    HANDLE hMutex
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjMutex = NULL;
    ISynchStateController *pssc = NULL;

    _ASSERTE(NULL != pthr);

    ENTRY("InternalReleaseMutex(pthr=%p, hMutex=%p)\n",
        pthr,
        hMutex
        );

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pthr,
        hMutex,
        &aotMutex,
        0, // should be MUTEX_MODIFY_STATE -- current ignored (no Win32 security)
        &pobjMutex
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to obtain object for handle %p (error %d)!\n", hMutex, palError);
        goto InternalReleaseMutexExit;
    }

    palError = pobjMutex->GetSynchStateController(
        pthr,
        &pssc
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining synch state controller\n", palError);
        goto InternalReleaseMutexExit;
    }

    palError = pssc->DecrementOwnershipCount();

    if (NO_ERROR != palError)
    {
        ERROR("Error %d decrementing mutex ownership count\n", palError);
        goto InternalReleaseMutexExit;
    }

InternalReleaseMutexExit:

    if (NULL != pssc)
    {
        pssc->ReleaseController();
    }

    if (NULL != pobjMutex)
    {
        pobjMutex->ReleaseReference(pthr);
    }

    LOGEXIT("InternalReleaseMutex returns %i\n", palError);

    return palError;
}